

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O1

void __thiscall BrightnessControl::force_adjust(BrightnessControl *this)

{
  pointer piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar6;
  float fVar7;
  int *piVar5;
  
  piVar5 = (this->thresh).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->thresh).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  fVar7 = SensorALS::get_value(this->als);
  fVar7 = roundf(fVar7);
  uVar6 = (long)piVar1 - (long)piVar5 >> 2;
  if (0 < (long)uVar6) {
    do {
      uVar3 = uVar6 >> 1;
      uVar6 = ~uVar3 + uVar6;
      piVar2 = piVar5 + uVar3 + 1;
      if ((int)fVar7 < piVar5[uVar3]) {
        uVar6 = uVar3;
        piVar2 = piVar5;
      }
      piVar5 = piVar2;
    } while (0 < (long)uVar6);
  }
  lVar4 = (long)piVar5 -
          (long)(this->thresh).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->cur = lVar4 >> 2;
  brightness_slide(this,*(int *)((long)(this->value).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar4));
  return;
}

Assistant:

void BrightnessControl::force_adjust()
{
	cur=std::upper_bound(thresh.begin(),thresh.end(),(int)roundf(als->get_value()))
		-thresh.begin();
	brightness_slide(value[cur]);
}